

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::GetSCCAnalysis
          (MessageSCCAnalyzer *this,SCC *scc)

{
  map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *this_00;
  FieldDescriptor *this_01;
  pointer ppDVar1;
  long lVar2;
  MessageSCCAnalyzer *this_02;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  Type TVar7;
  MessageAnalysis MVar8;
  size_type sVar9;
  MessageAnalysis *pMVar10;
  Descriptor *descriptor;
  SCC *scc_00;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  int j;
  long lVar14;
  long lVar15;
  SCC *scc_local;
  Descriptor *local_60;
  undefined8 local_58;
  map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *local_50;
  ulong local_48;
  Options *local_40;
  MessageSCCAnalyzer *local_38;
  
  this_00 = &this->analysis_cache_;
  scc_local = scc;
  sVar9 = std::
          map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
          ::count(this_00,&scc_local);
  if (sVar9 == 0) {
    local_40 = &this->options_;
    local_50 = this_00;
    local_38 = this;
    bVar3 = UsingImplicitWeakFields
                      (*(FileDescriptor **)
                        (*(scc_local->descriptors).
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x10),local_40);
    local_58 = 0;
    bVar6 = false;
    bVar12 = false;
    bVar11 = false;
    uVar13 = 0;
    while (ppDVar1 = (scc_local->descriptors).
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          uVar13 < (ulong)((long)(scc_local->descriptors).
                                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3)) {
      local_60 = ppDVar1[uVar13];
      if (0 < *(int *)(local_60 + 0x78)) {
        bVar12 = true;
      }
      lVar15 = 0;
      local_48 = uVar13;
      for (lVar14 = 0; lVar14 < *(int *)(local_60 + 4); lVar14 = lVar14 + 1) {
        lVar2 = *(long *)(local_60 + 0x28);
        this_01 = (FieldDescriptor *)(lVar2 + lVar15);
        if ((*(byte *)(lVar2 + 1 + lVar15) & 0x60) == 0x40) {
          bVar11 = true;
        }
        if (*(char *)(*(long *)(lVar2 + 0x38 + lVar15) + 0x4f) != '\0') {
          bVar3 = true;
        }
        TVar7 = FieldDescriptor::type(this_01);
        if (TVar7 - TYPE_GROUP < 2) {
          descriptor = FieldDescriptor::message_type(this_01);
          this_02 = local_38;
          scc_00 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                   GetSCC(&local_38->analyzer_,descriptor);
          if (scc_00 == scc_local) {
            local_58 = CONCAT71((int7)((ulong)scc_00 >> 8),1);
          }
          else {
            MVar8 = GetSCCAnalysis(this_02,scc_00);
            bVar4 = IsLazilyVerifiedLazy(this_01,local_40);
            bVar5 = 0;
            if (!bVar4) {
              bVar5 = MVar8.contains_required & 1;
            }
            bVar6 = (bool)(MVar8.contains_cord & 1U | bVar6);
            bVar12 = (bool)(MVar8.contains_extension & 1U | bVar12);
            bVar11 = (bool)(bVar5 | bVar11);
            bVar3 = (bool)(MVar8.contains_weak & 1U | bVar3);
          }
        }
        else if (((TVar7 == TYPE_BYTES) || (TVar7 == TYPE_STRING)) &&
                (*(int *)(*(long *)(lVar2 + 0x38 + lVar15) + 0x48) == 1)) {
          bVar6 = true;
        }
        lVar15 = lVar15 + 0x48;
      }
      uVar13 = local_48 + 1;
    }
    pMVar10 = std::
              map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
              ::operator[](local_50,&scc_local);
    pMVar10->is_recursive = SUB81(local_58,0);
    pMVar10->contains_cord = bVar6;
    pMVar10->contains_extension = bVar12;
    pMVar10->contains_required = bVar11;
    pMVar10->contains_weak = bVar3;
  }
  else {
    pMVar10 = std::
              map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
              ::operator[](this_00,&scc_local);
  }
  return *pMVar10;
}

Assistant:

MessageAnalysis MessageSCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  if (analysis_cache_.count(scc)) return analysis_cache_[scc];
  MessageAnalysis result;
  if (UsingImplicitWeakFields(scc->GetFile(), options_)) {
    result.contains_weak = true;
  }
  for (int i = 0; i < scc->descriptors.size(); i++) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int j = 0; j < descriptor->field_count(); j++) {
      const FieldDescriptor* field = descriptor->field(j);
      if (field->is_required()) {
        result.contains_required = true;
      }
      if (field->options().weak()) {
        result.contains_weak = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->options().ctype() == FieldOptions::CORD) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = analyzer_.GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
            result.contains_weak |= analysis.contains_weak;
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = result;
}